

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

Blend __thiscall
PartsBupOutputter::prepareImageInTmp
          (PartsBupOutputter *this,Image *img,Point pos,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask,Image *target)

{
  pointer pCVar1;
  Blend BVar2;
  pointer pCVar3;
  pointer pMVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  byte bVar8;
  ulong uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *puVar12;
  _Vector_base<MaskRect,_std::allocator<MaskRect>_> local_48;
  
  Image::fastResize(&this->tmp,img->size);
  pCVar1 = (this->tmp).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->tmp).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    pCVar3->r = '\0';
    pCVar3->g = '\0';
    pCVar3->b = '\0';
    pCVar3->a = '\0';
  }
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)&local_48,mask);
  Image::drawOnto(img,&this->tmp,(Point)0x0,(vector<MaskRect,_std::allocator<MaskRect>_> *)&local_48
                 );
  std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base(&local_48);
  lVar6 = (long)(img->size).width * 4;
  lVar5 = (long)(target->size).width * 4;
  bVar7 = false;
  bVar8 = 0;
  for (pMVar4 = (mask->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar4 != (mask->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
                super__Vector_impl_data._M_finish; pMVar4 = pMVar4 + 1) {
    uVar9 = (ulong)pMVar4->y1;
    puVar12 = &((img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_start)->a + lVar6 * uVar9;
    puVar10 = &(target->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start[pos.x].a + (((long)pos >> 0x20) + uVar9) * lVar5;
    for (; uVar9 < pMVar4->y2; uVar9 = uVar9 + 1) {
      for (uVar11 = (ulong)pMVar4->x1; uVar11 < pMVar4->x2; uVar11 = uVar11 + 1) {
        if (puVar10[uVar11 * 4] != '\0') {
          if (puVar12[uVar11 * 4] == '\0') {
            bVar7 = true;
          }
          else if (puVar12[uVar11 * 4] != 0xff) {
            bVar8 = 1;
          }
        }
      }
      puVar12 = puVar12 + lVar6;
      puVar10 = puVar10 + lVar5;
    }
  }
  BVar2 = NotPossible;
  if (!bVar7) {
    BVar2 = (uint)bVar8;
  }
  return BVar2;
}

Assistant:

Blend prepareImageInTmp(const Image& img, Point pos, const std::vector<MaskRect>& mask, const Image& target) {
		tmp.fastResize(img.size);
		std::fill(tmp.colorData.begin(), tmp.colorData.end(), Color());
		bool hasPartiallyTransparent = false;
		bool hasFullyTransparent = false;
		img.drawOnto(tmp, {0, 0}, mask);
		for (const auto& section : mask) {
			for (int y = section.y1; y < section.y2; y++) {
				for (int x = section.x1; x < section.x2; x++) {
					Color px = img.pixel(x, y);
					if (target.pixel(pos.x + x, pos.y + y).a == 0) {
						continue;
					}
					if (px.a == 0) {
						hasFullyTransparent = true;
					}
					else if (px.a < 255) {
						hasPartiallyTransparent = true;
					}
				}
			}
		}
		return hasFullyTransparent ? Blend::NotPossible
		     : hasPartiallyTransparent ? Blend::CustomBlend
		     : Blend::AlphaBlend;
	}